

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[12],kj::StringPtr&,kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [12],StringPtr *params_1,
          StringPtr *params_2,char (*params_3) [2])

{
  char (*value) [12];
  StringPtr *pSVar1;
  char (*value_00) [2];
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  StringPtr *local_30;
  char (*params_local_3) [2];
  StringPtr *params_local_2;
  StringPtr *params_local_1;
  char (*params_local) [12];
  
  local_30 = params_2;
  params_local_3 = (char (*) [2])params_1;
  params_local_2 = (StringPtr *)params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [12])__return_storage_ptr__;
  value = ::const((char (*) [12])this);
  local_40 = toCharSequence<char_const(&)[12]>(value);
  pSVar1 = fwd<kj::StringPtr&>(params_local_2);
  local_50 = toCharSequence<kj::StringPtr&>(pSVar1);
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)params_local_3);
  local_60 = toCharSequence<kj::StringPtr&>(pSVar1);
  value_00 = ::const((char (*) [2])local_30);
  local_70 = toCharSequence<char_const(&)[2]>(value_00);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}